

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::GenerateHelperToArrayPushFastPath
          (Lowerer *this,Instr *instr,LabelInstr *bailOutLabelHelper)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  JnHelperMethod local_34;
  Opnd *pOStack_30;
  JnHelperMethod helperMethod;
  Opnd *elementHelperOpnd;
  Opnd *arrayHelperOpnd;
  LabelInstr *bailOutLabelHelper_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  arrayHelperOpnd = (Opnd *)bailOutLabelHelper;
  bailOutLabelHelper_local = (LabelInstr *)instr;
  instr_local = (Instr *)this;
  elementHelperOpnd = IR::Instr::UnlinkSrc1(instr);
  pOStack_30 = IR::Instr::UnlinkSrc2(&bailOutLabelHelper_local->super_Instr);
  bVar2 = IR::Opnd::IsInt32(pOStack_30);
  if (bVar2) {
    local_36.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(elementHelperOpnd);
    bVar2 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_36.field_0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3027,"(arrayHelperOpnd->GetValueType().IsLikelyNativeIntArray())",
                         "arrayHelperOpnd->GetValueType().IsLikelyNativeIntArray()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_34 = HelperArray_NativeIntPush;
    LowererMD::LoadHelperArgument
              (&this->m_lowererMD,&bailOutLabelHelper_local->super_Instr,pOStack_30);
  }
  else {
    bVar2 = IR::Opnd::IsFloat(pOStack_30);
    if (bVar2) {
      local_38.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(elementHelperOpnd);
      bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_38.field_0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x302e,"(arrayHelperOpnd->GetValueType().IsLikelyNativeFloatArray())",
                           "arrayHelperOpnd->GetValueType().IsLikelyNativeFloatArray()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      local_34 = HelperArray_NativeFloatPush;
      LowererMD::LoadDoubleHelperArgument
                (&this->m_lowererMD,&bailOutLabelHelper_local->super_Instr,pOStack_30);
    }
    else {
      local_34 = HelperArray_VarPush;
      LowererMD::LoadHelperArgument
                (&this->m_lowererMD,&bailOutLabelHelper_local->super_Instr,pOStack_30);
    }
  }
  LowererMD::LoadHelperArgument
            (&this->m_lowererMD,&bailOutLabelHelper_local->super_Instr,elementHelperOpnd);
  LoadScriptContext(this,&bailOutLabelHelper_local->super_Instr);
  pIVar4 = LowererMD::ChangeToHelperCall
                     (&this->m_lowererMD,&bailOutLabelHelper_local->super_Instr,local_34,
                      (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::GenerateHelperToArrayPushFastPath(IR::Instr * instr, IR::LabelInstr * bailOutLabelHelper)
{
    IR::Opnd * arrayHelperOpnd = instr->UnlinkSrc1();
    IR::Opnd * elementHelperOpnd = instr->UnlinkSrc2();
    IR::JnHelperMethod helperMethod;

    if(elementHelperOpnd->IsInt32())
    {
        Assert(arrayHelperOpnd->GetValueType().IsLikelyNativeIntArray());
        helperMethod = IR::HelperArray_NativeIntPush;

        m_lowererMD.LoadHelperArgument(instr, elementHelperOpnd);
    }
    else if(elementHelperOpnd->IsFloat())
    {
        Assert(arrayHelperOpnd->GetValueType().IsLikelyNativeFloatArray());
        helperMethod = IR::HelperArray_NativeFloatPush;

        m_lowererMD.LoadDoubleHelperArgument(instr, elementHelperOpnd);
    }
    else
    {
        helperMethod = IR::HelperArray_VarPush;
        m_lowererMD.LoadHelperArgument(instr, elementHelperOpnd);
    }

    m_lowererMD.LoadHelperArgument(instr, arrayHelperOpnd);
    LoadScriptContext(instr);
    return m_lowererMD.ChangeToHelperCall(instr, helperMethod);
}